

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall
amrex::MLMG::getFluxes
          (MLMG *this,
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *a_flux,Location a_loc)

{
  bool bVar1;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_RDI;
  Any *s;
  iterator __end1;
  iterator __begin1;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *__range1;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> solmf;
  vector<amrex::Any,_std::allocator<amrex::Any>_> *in_stack_ffffffffffffff78;
  MultiFab *in_stack_ffffffffffffff80;
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
  *in_stack_ffffffffffffff90;
  MLMG *in_stack_ffffffffffffff98;
  __normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_> local_48;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_40;
  char *local_8;
  
  bVar1 = MLLinOp::isCellCentered
                    ((MLLinOp *)
                     in_RDI[3].super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start);
  if (!bVar1) {
    local_8 = "Calling wrong getFluxes for nodal solver";
    Abort_host((char *)in_stack_ffffffffffffff90);
  }
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x125cfc2);
  local_40 = in_RDI + 6;
  local_48._M_current =
       (Any *)std::vector<amrex::Any,_std::allocator<amrex::Any>_>::begin(in_stack_ffffffffffffff78)
  ;
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_>::
    operator*(&local_48);
    in_stack_ffffffffffffff80 = Any::get<amrex::MultiFab>((Any *)in_stack_ffffffffffffff98);
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_ffffffffffffff80,(value_type *)in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_>::
    operator++(&local_48);
  }
  getFluxes(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_RDI,
            (Location)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x125d08c);
  return;
}

Assistant:

void
MLMG::getFluxes (const Vector<Array<MultiFab*,AMREX_SPACEDIM> >& a_flux,
                 Location a_loc)
{
    if (!linop.isCellCentered()) {
       amrex::Abort("Calling wrong getFluxes for nodal solver");
    }

    AMREX_ASSERT(sol.size() == a_flux.size());
    Vector<MultiFab*> solmf;
    for (auto & s : sol) {
        solmf.push_back(&(s.get<MultiFab>()));
    }
    getFluxes(a_flux, solmf, a_loc);
}